

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O0

Image * rw::xbox::rasterToImage(Raster *raster)

{
  uint8 uVar1;
  int iVar2;
  uint8 *pixels_00;
  int iVar3;
  uint uVar4;
  bool bVar5;
  int local_8c;
  uint8 *puStack_88;
  int32 x;
  uint8 *imgrow;
  int32 y;
  uint8 tmp;
  uint8 *pixels;
  uint8 *imgpixels;
  uint8 *puStack_60;
  int32 i;
  uint8 *in;
  uint8 *out;
  int32 pallength;
  uint8 *pix;
  int h;
  int w;
  XboxRaster *natras;
  bool unlock;
  Image *image;
  int32 depth;
  Raster *raster_local;
  
  bVar5 = raster->pixels == (uint8 *)0x0;
  if (bVar5) {
    Raster::lock(raster,0,2);
  }
  iVar3 = nativeRasterOffset;
  if ((*(byte *)((long)&raster->height + (long)nativeRasterOffset + 1) & 1) == 0) {
    uVar4 = raster->format & 0xf00;
    if (uVar4 == 0x100) {
      image._4_4_ = 0x10;
    }
    else if (((uVar4 != 0x200) && (uVar4 != 0x300)) && (uVar4 != 0x400)) {
      if (uVar4 == 0x500) {
        image._4_4_ = 0x20;
      }
      else if (uVar4 == 0x600) {
        image._4_4_ = 0x18;
      }
      else if (uVar4 == 0xa00) {
        image._4_4_ = 0x10;
      }
    }
    out._4_4_ = 0;
    if ((raster->format & 0x4000U) == 0x4000) {
      image._4_4_ = 4;
      out._4_4_ = 0x10;
    }
    else if ((raster->format & 0x2000U) == 0x2000) {
      image._4_4_ = 8;
      out._4_4_ = 0x100;
    }
    raster_local = (Raster *)Image::create(raster->width,raster->height,image._4_4_);
    Image::allocate((Image *)raster_local);
    if (out._4_4_ != 0) {
      in = *(uint8 **)&raster_local->stride;
      puStack_60 = *(uint8 **)((long)&raster->flags + (long)iVar3);
      for (imgpixels._4_4_ = 0; imgpixels._4_4_ < out._4_4_; imgpixels._4_4_ = imgpixels._4_4_ + 1)
      {
        conv_BGRA8888_from_RGBA8888(in,puStack_60);
        puStack_60 = puStack_60 + 4;
        in = in + 4;
      }
    }
    pixels = *(uint8 **)&raster_local->height;
    unswizzle(pixels,raster->pixels,raster_local->type,raster_local->flags,raster_local->format);
    if (8 < image._4_4_) {
      for (imgrow._0_4_ = 0; (int)imgrow < raster_local->flags; imgrow._0_4_ = (int)imgrow + 1) {
        puStack_88 = pixels;
        for (local_8c = 0; local_8c < raster_local->type; local_8c = local_8c + 1) {
          uVar4 = raster->format & 0xf00;
          if ((uVar4 == 0x500) || (uVar4 == 0x600)) {
            uVar1 = *puStack_88;
            *puStack_88 = puStack_88[2];
            puStack_88[2] = uVar1;
            puStack_88 = puStack_88 + raster_local->format;
          }
        }
        pixels = pixels + raster_local->width;
      }
    }
    Image::compressPalette((Image *)raster_local);
    if (bVar5) {
      Raster::unlock(raster,0);
    }
  }
  else {
    pix._4_4_ = raster->width;
    pix._0_4_ = raster->height;
    if (pix._4_4_ < 4) {
      pix._4_4_ = 4;
    }
    if ((int)pix < 4) {
      pix._0_4_ = 4;
    }
    raster_local = (Raster *)Image::create(pix._4_4_,(int)pix,0x20);
    Image::allocate((Image *)raster_local);
    pixels_00 = raster->pixels;
    iVar2 = *(int *)((long)&raster->format + (long)iVar3);
    if (iVar2 == 0xc) {
      Image::setPixelsDXT((Image *)raster_local,1,pixels_00);
      if ((*(byte *)((long)&raster->height + (long)iVar3) & 1) == 0) {
        Image::removeMask((Image *)raster_local);
      }
    }
    else if (iVar2 == 0xe) {
      Image::setPixelsDXT((Image *)raster_local,3,pixels_00);
    }
    else {
      if (iVar2 != 0xf) {
        Image::destroy((Image *)raster_local);
        if (bVar5) {
          Raster::unlock(raster,0);
        }
        return (Image *)0x0;
      }
      Image::setPixelsDXT((Image *)raster_local,5,pixels_00);
    }
    raster_local->type = raster->width;
    raster_local->flags = raster->height;
    if (bVar5) {
      Raster::unlock(raster,0);
    }
  }
  return (Image *)raster_local;
}

Assistant:

Image*
rasterToImage(Raster *raster)
{
	int32 depth;
	Image *image;

	bool unlock = false;
	if(raster->pixels == nil){
		raster->lock(0, Raster::LOCKREAD);
		unlock = true;
	}

	XboxRaster *natras = GETXBOXRASTEREXT(raster);
	if(natras->customFormat){
		int w = raster->width;
		int h = raster->height;
		// pixels are in the upper right corner
		if(w < 4) w = 4;
		if(h < 4) h = 4;
		image = Image::create(w, h, 32);
		image->allocate();
		uint8 *pix = raster->pixels;
		switch(natras->format){
		case D3DFMT_DXT1:
			image->setPixelsDXT(1, pix);
			// TODO: is this correct?
			if(!natras->hasAlpha)
				image->removeMask();
			break;
		case D3DFMT_DXT3:
			image->setPixelsDXT(3, pix);
			break;
		case D3DFMT_DXT5:
			image->setPixelsDXT(5, pix);
			break;
		default:
			assert(0 && "unknown format");
			image->destroy();
			if(unlock)
				raster->unlock(0);
			return nil;
		}
		// fix it up again
		image->width = raster->width;
		image->height = raster->height;

		if(unlock)
			raster->unlock(0);
		return image;
	}

	switch(raster->format & 0xF00){
	case Raster::C1555:
		depth = 16;
		break;
	case Raster::C8888:
		depth = 32;
		break;
	case Raster::C888:
		depth = 24;
		break;
	case Raster::C555:
		depth = 16;
		break;

	default:
	case Raster::C565:
	case Raster::C4444:
	case Raster::LUM8:
		assert(0 && "unsupported raster format");
	}
	int32 pallength = 0;
	if((raster->format & Raster::PAL4) == Raster::PAL4){
		depth = 4;
		pallength = 16;
	}else if((raster->format & Raster::PAL8) == Raster::PAL8){
		depth = 8;
		pallength = 256;
	}

	image = Image::create(raster->width, raster->height, depth);
	image->allocate();

	if(pallength){
		uint8 *out = image->palette;
		uint8 *in = (uint8*)natras->palette;
		// bytes are BGRA unlike regular d3d!
		for(int32 i = 0; i < pallength; i++){
			conv_BGRA8888_from_RGBA8888(out, in);
			in += 4;
			out += 4;
		}
	}

	uint8 *imgpixels = image->pixels;
	uint8 *pixels = raster->pixels;

	// NB:
	assert(image->bpp == (int)natras->bpp);
	assert(image->stride == raster->stride);
	unswizzle(imgpixels, pixels, image->width, image->height, image->bpp);
	// Fix RGB order
	uint8 tmp;
	if(depth > 8)
		for(int32 y = 0; y < image->height; y++){
			uint8 *imgrow = imgpixels;
		//	uint8 *rasrow = pixels;
			for(int32 x = 0; x < image->width; x++){
				switch(raster->format & 0xF00){
				case Raster::C8888:
				case Raster::C888:
					tmp = imgrow[0];
					imgrow[0] = imgrow[2];
					imgrow[2] = tmp;
					imgrow += image->bpp;
					break;
				}
			}
			imgpixels += image->stride;
		//	pixels += raster->stride;
		}
	image->compressPalette();

	if(unlock)
		raster->unlock(0);

	return image;
}